

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

SequenceSymbol *
slang::ast::SequenceSymbol::fromSyntax(Scope *scope,SequenceDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar1;
  Compilation *args_2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL> *__s;
  SyntaxNode *in_RSI;
  Symbol *in_RDI;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  Scope *in_stack_000000b0;
  SequenceSymbol *result;
  Compilation *comp;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff18;
  Token *in_stack_ffffffffffffff20;
  Compilation *args_1;
  Compilation *in_stack_ffffffffffffff38;
  SequenceSymbol *pSVar2;
  BumpAllocator *in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff50;
  pointer local_a8;
  size_t local_a0;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_88 [2];
  SourceLocation local_38;
  string_view local_30;
  SequenceSymbol *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  Symbol *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  args_2 = Scope::getCompilation((Scope *)in_RDI);
  args_1 = args_2;
  local_18 = args_2;
  local_30 = parsing::Token::valueText(in_stack_ffffffffffffff20);
  local_38 = parsing::Token::location((Token *)(local_10 + 4));
  local_20 = BumpAllocator::
             emplace<slang::ast::SequenceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        (basic_string_view<char,_std::char_traits<char>_> *)args_1,
                        (SourceLocation *)args_2);
  Symbol::setSyntax(&local_20->super_Symbol,local_10);
  pSVar2 = local_20;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff50._M_extent_value;
  syntax_00._M_ptr = in_stack_ffffffffffffff48;
  Symbol::setAttributes(local_8,(Scope *)pSVar2,syntax_00);
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)0x729dd8);
  src = extraout_RDX;
  if (local_10[4].previewNode != (SyntaxNode *)0x0) {
    AssertionPortSymbol::buildPorts
              (in_stack_000000b0,(AssertionItemPortListSyntax *)ports.stackBase._24_8_,
               (SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *)ports.stackBase._16_8_);
    src = extraout_RDX_00;
  }
  iVar1 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_88,(EVP_PKEY_CTX *)local_18,src);
  std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar1),__s);
  pSVar2 = local_20;
  (local_20->ports)._M_ptr = local_a8;
  (local_20->ports)._M_extent._M_extent_value = local_a0;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)0x729e9f);
  return pSVar2;
}

Assistant:

SequenceSymbol& SequenceSymbol::fromSyntax(const Scope& scope,
                                           const SequenceDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SequenceSymbol>(comp, syntax.name.valueText(),
                                               syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList)
        AssertionPortSymbol::buildPorts(*result, *syntax.portList, ports);
    result->ports = ports.copy(comp);

    return *result;
}